

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

String * __thiscall
kj::_::encodeCEscapeImpl
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_unsigned_char> bytes,bool isBinary)

{
  String *pSVar1;
  uchar *count;
  uchar *puVar2;
  byte b;
  Vector<char> escaped;
  _ local_89;
  StringPtr local_88;
  undefined4 local_74;
  String *local_70;
  ArrayBuilder<char> local_68;
  Array<char> local_48;
  
  count = bytes.ptr;
  local_74 = (undefined4)bytes.size_;
  local_70 = __return_storage_ptr__;
  local_68.ptr = HeapArrayDisposer::allocateUninitialized<char>((size_t)count);
  local_68.endPtr = local_68.ptr + (long)count;
  local_68.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  local_68.pos = local_68.ptr;
  for (puVar2 = (uchar *)0x0; count != puVar2; puVar2 = puVar2 + 1) {
    local_89 = this[(long)puVar2];
    switch(local_89) {
    case (_)0x7:
      local_88.content.ptr = "\\a";
      local_88.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      break;
    case (_)0x8:
      local_88.content.ptr = "\\b";
      local_88.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      break;
    case (_)0x9:
      local_88.content.ptr = "\\t";
      local_88.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      break;
    case (_)0xa:
      local_88.content.ptr = "\\n";
      local_88.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      break;
    case (_)0xb:
      local_88.content.ptr = "\\v";
      local_88.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      break;
    case (_)0xc:
      local_88.content.ptr = "\\f";
      local_88.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      break;
    case (_)0xd:
      local_88.content.ptr = "\\r";
      local_88.content.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      break;
    default:
      if (local_89 == (_)0x22) {
        local_88.content.ptr = "\\\"";
        local_88.content.size_ = 3;
        Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      }
      else if (local_89 == (_)0x27) {
        local_88.content.ptr = "\\\'";
        local_88.content.size_ = 3;
        Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      }
      else if (local_89 == (_)0x5c) {
        local_88.content.ptr = "\\\\";
        local_88.content.size_ = 3;
        Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,&local_88);
      }
      else if ((byte)((char)local_89 < '\0' & (byte)local_74 |
                     (local_89 == (_)0x7f || (byte)local_89 < 0x20)) == 1) {
        local_88.content.ptr = (char *)CONCAT71(local_88.content.ptr._1_7_,0x5c);
        Vector<char>::add<char>((Vector<char> *)&local_68,(char *)&local_88);
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789abcdef" + ((byte)local_89 >> 6));
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789abcdef" + ((byte)local_89 >> 3 & 7));
        Vector<char>::add<char_const&>
                  ((Vector<char> *)&local_68,"0123456789abcdef" + ((byte)local_89 & 7));
      }
      else {
        Vector<char>::add<unsigned_char&>((Vector<char> *)&local_68,(uchar *)&local_89);
      }
    }
  }
  local_88.content.ptr = (char *)((ulong)local_88.content.ptr & 0xffffffff00000000);
  Vector<char>::add<int>((Vector<char> *)&local_68,(int *)&local_88);
  Vector<char>::releaseAsArray(&local_48,(Vector<char> *)&local_68);
  pSVar1 = local_70;
  (local_70->content).ptr = local_48.ptr;
  (local_70->content).size_ = local_48.size_;
  (local_70->content).disposer = local_48.disposer;
  local_48.ptr = (char *)0x0;
  local_48.size_ = 0;
  Array<char>::~Array(&local_48);
  ArrayBuilder<char>::dispose(&local_68);
  return pSVar1;
}

Assistant:

String encodeCEscapeImpl(ArrayPtr<const byte> bytes, bool isBinary) {
  Vector<char> escaped(bytes.size());

  for (byte b: bytes) {
    switch (b) {
      case '\a': escaped.addAll("\\a"_kj); break;
      case '\b': escaped.addAll("\\b"_kj); break;
      case '\f': escaped.addAll("\\f"_kj); break;
      case '\n': escaped.addAll("\\n"_kj); break;
      case '\r': escaped.addAll("\\r"_kj); break;
      case '\t': escaped.addAll("\\t"_kj); break;
      case '\v': escaped.addAll("\\v"_kj); break;
      case '\'': escaped.addAll("\\\'"_kj); break;
      case '\"': escaped.addAll("\\\""_kj); break;
      case '\\': escaped.addAll("\\\\"_kj); break;
      default:
        if (b < 0x20 || b == 0x7f || (isBinary && b > 0x7f)) {
          // Use octal escape, not hex, because hex escapes technically have no length limit and
          // so can create ambiguity with subsequent characters.
          escaped.add('\\');
          escaped.add(HEX_DIGITS[b / 64]);
          escaped.add(HEX_DIGITS[(b / 8) % 8]);
          escaped.add(HEX_DIGITS[b % 8]);
        } else {
          escaped.add(b);
        }
        break;
    }
  }

  escaped.add(0);
  return String(escaped.releaseAsArray());
}